

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O2

dynamic_bit_vector * bsim::xorr(dynamic_bit_vector *__return_storage_ptr__,dynamic_bit_vector *a)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  allocator local_29;
  string local_28;
  
  uVar2 = a->N;
  bVar1 = 0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    bVar1 = bVar1 + ((a->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar3 >> 3] >> ((byte)uVar3 & 7));
  }
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_28,"0",&local_29);
    dynamic_bit_vector::dynamic_bit_vector(__return_storage_ptr__,1,&local_28);
  }
  else {
    std::__cxx11::string::string((string *)&local_28,"1",&local_29);
    dynamic_bit_vector::dynamic_bit_vector(__return_storage_ptr__,1,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

static inline dynamic_bit_vector
  xorr(const dynamic_bit_vector& a) {
    int numSet = 0;
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) == 1) {
	numSet++;
      }
    }

    if ((numSet % 2) == 0) {
      return dynamic_bit_vector(1, "0");
    }

    return dynamic_bit_vector(1, "1");
  }